

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_greaterp(LispPTR tosm1,LispPTR tos)

{
  LispPTR LVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  LispPTR LVar4;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar2 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar2 = tosm1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
    goto LAB_00106eb7;
    pLVar3 = NativeAligned4FromLAddr(tosm1);
    LVar2 = *pLVar3;
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar4 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    LVar4 = tos & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_00106eb7:
      LVar2 = N_OP_fgreaterp(tosm1,tos);
      return LVar2;
    }
    pLVar3 = NativeAligned4FromLAddr(tos);
    LVar4 = *pLVar3;
  }
  LVar1 = 0x4c;
  if ((int)LVar2 <= (int)LVar4) {
    LVar1 = 0;
  }
  return LVar1;
}

Assistant:

LispPTR N_OP_greaterp(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;

  N_GETNUMBER(tosm1, arg1, do_ufn);
  N_GETNUMBER(tos, arg2, do_ufn);

  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);

do_ufn:
  return (N_OP_fgreaterp(tosm1, tos));
}